

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void dlib::cpu::compute_adam_update
               (size_t begin,size_t end,tensor *s,tensor *m,tensor *v,float t,float learning_rate,
               float weight_decay,float momentum1,float momentum2,tensor *params,tensor *params_grad
               )

{
  uint *puVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ostream *poVar9;
  fatal_error *pfVar10;
  size_t i;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [64];
  string local_1c8;
  ostringstream dlib_o_out;
  uint auStack_190 [88];
  long lVar8;
  undefined1 extraout_var_04 [60];
  
  uVar2 = s->m_size;
  if ((((uVar2 == m->m_size) && (uVar2 == v->m_size)) && (uVar2 == params->m_size)) &&
     (uVar2 == params_grad->m_size)) {
    if ((begin <= end) && (end <= uVar2)) {
      fVar12 = powf(momentum2,t);
      fVar12 = 1.0 - fVar12;
      if (fVar12 < 0.0) {
        auVar15._0_4_ = sqrtf(fVar12);
        auVar15._4_60_ = extraout_var_04;
        auVar11 = auVar15._0_16_;
      }
      else {
        auVar11 = vsqrtss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12));
      }
      fVar12 = powf(momentum1,t);
      iVar4 = (*m->_vptr_tensor[3])(m);
      lVar8 = CONCAT44(extraout_var,iVar4);
      iVar4 = (*v->_vptr_tensor[3])(v);
      iVar5 = (*s->_vptr_tensor[4])(s);
      iVar6 = (*params->_vptr_tensor[2])(params);
      iVar7 = (*params_grad->_vptr_tensor[2])(params_grad);
      auVar3._8_4_ = 0x80000000;
      auVar3._0_8_ = 0x8000000080000000;
      auVar3._12_4_ = 0x80000000;
      auVar11 = vxorps_avx512vl(auVar11,auVar3);
      for (; end != begin; begin = begin + 1) {
        auVar3 = vfmadd213ss_fma(ZEXT416(*(uint *)(CONCAT44(extraout_var_02,iVar6) + begin * 4)),
                                 ZEXT416((uint)weight_decay),
                                 ZEXT416(*(uint *)(CONCAT44(extraout_var_03,iVar7) + begin * 4)));
        fVar13 = auVar3._0_4_;
        auVar3 = vfmadd231ss_fma(ZEXT416((uint)((1.0 - momentum1) * fVar13)),
                                 ZEXT416((uint)momentum1),ZEXT416(*(uint *)(lVar8 + begin * 4)));
        *(int *)(lVar8 + begin * 4) = auVar3._0_4_;
        auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * (1.0 - momentum2) * fVar13)),
                                 ZEXT416((uint)momentum2),
                                 ZEXT416(*(uint *)(CONCAT44(extraout_var_00,iVar4) + begin * 4)));
        fVar14 = auVar3._0_4_;
        *(float *)(CONCAT44(extraout_var_00,iVar4) + begin * 4) = fVar14;
        fVar13 = *(float *)(lVar8 + begin * 4);
        if (fVar14 < 0.0) {
          fVar14 = sqrtf(fVar14);
        }
        else {
          auVar3 = vsqrtss_avx(auVar3,auVar3);
          fVar14 = auVar3._0_4_;
        }
        *(float *)(CONCAT44(extraout_var_01,iVar5) + begin * 4) =
             (((auVar11._0_4_ * learning_rate) / (1.0 - fVar12)) * fVar13) / (fVar14 + 1e-08);
      }
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar9 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x2b5);
    std::operator<<(poVar9,".\n");
    poVar9 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                            );
    std::operator<<(poVar9,".\n");
    poVar9 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar9 = std::operator<<(poVar9,
                             "void dlib::cpu::compute_adam_update(size_t, size_t, tensor &, tensor &, tensor &, const float, const float, const float, const float, const float, const tensor &, const tensor &)"
                            );
    std::operator<<(poVar9,".\n\n");
    poVar9 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar9 = std::operator<<(poVar9,"begin <= end && end <= params.size()");
    std::operator<<(poVar9,".\n");
    puVar1 = (uint *)((long)auStack_190 + *(long *)(_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar9 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar9,"\n");
    pfVar10 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar10,EBROKEN_ASSERT,&local_1c8);
    __cxa_throw(pfVar10,&fatal_error::typeinfo,error::~error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
  poVar9 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x2b4);
  std::operator<<(poVar9,".\n");
  poVar9 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
  poVar9 = std::operator<<(poVar9,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                          );
  std::operator<<(poVar9,".\n");
  poVar9 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
  poVar9 = std::operator<<(poVar9,
                           "void dlib::cpu::compute_adam_update(size_t, size_t, tensor &, tensor &, tensor &, const float, const float, const float, const float, const float, const tensor &, const tensor &)"
                          );
  std::operator<<(poVar9,".\n\n");
  poVar9 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
  poVar9 = std::operator<<(poVar9,
                           "s.size() == m.size() && s.size() == v.size() && s.size() == params.size() && s.size() == params_grad.size()"
                          );
  std::operator<<(poVar9,".\n");
  puVar1 = (uint *)((long)auStack_190 + *(long *)(_dlib_o_out + -0x18));
  *puVar1 = *puVar1 | 1;
  poVar9 = std::operator<<((ostream *)&dlib_o_out,"");
  std::operator<<(poVar9,"\n");
  pfVar10 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(pfVar10,EBROKEN_ASSERT,&local_1c8);
  __cxa_throw(pfVar10,&fatal_error::typeinfo,error::~error);
}

Assistant:

void compute_adam_update (
            size_t begin,
            size_t end,
            tensor& s,
            tensor& m,
            tensor& v,
            const float t,
            const float learning_rate,
            const float weight_decay,
            const float momentum1,
            const float momentum2,
            const tensor& params,
            const tensor& params_grad
        )
        {
            DLIB_CASSERT(s.size() == m.size() &&
                         s.size() == v.size() &&
                         s.size() == params.size() &&
                         s.size() == params_grad.size());
            DLIB_CASSERT(begin <= end && end <= params.size());
            const float eps = 1e-8;
            const float alpha = learning_rate*std::sqrt(1-std::pow(momentum2,t))/(1-std::pow(momentum1, t));

            // The loop is equivalent to doing this:
            //   m = momentum1*m + (1-momentum1)    *   (weight_decay*params + params_grad);
            //   v = momentum2*v + (1-momentum2)*squared(weight_decay*params + params_grad);
            //   s = -alpha*m/(sqrt(v) + eps);
            auto pm = m.host();
            auto pv = v.host();
            auto ps = s.host_write_only();
            auto pparams = params.host();
            auto ppgrad = params_grad.host();
            for (size_t i = begin; i < end; ++i)
            {
                float g = weight_decay*pparams[i] + ppgrad[i];
                pm[i] = momentum1*pm[i] + (1-momentum1)*g;
                pv[i] = momentum2*pv[i] + (1-momentum2)*g*g;
                ps[i] = -alpha*pm[i]/(std::sqrt(pv[i]) + eps);
            }
        }